

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_rope_f16(ggml_compute_params *params,ggml_tensor *dst,bool forward)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ggml_fp16_t *pgVar6;
  undefined2 *puVar7;
  int iVar8;
  byte in_DL;
  long in_RSI;
  int *in_RDI;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  ggml_fp16_t *dst_data_4;
  ggml_fp16_t *src_4;
  int64_t i0_4;
  float x1_3;
  float x0_3;
  ggml_fp16_t *dst_data_3;
  ggml_fp16_t *src_3;
  float sin_theta_3;
  float cos_theta_3;
  int64_t ic_2;
  int64_t i0_3;
  float x1_2;
  float x0_2;
  ggml_fp16_t *dst_data_2;
  ggml_fp16_t *src_2;
  float sin_theta_2;
  float cos_theta_2;
  int64_t i0_2;
  float x1_1;
  float x0_1;
  ggml_fp16_t *dst_data_1;
  ggml_fp16_t *src_1;
  float sin_theta_1;
  float cos_theta_1;
  int64_t ic_1;
  int64_t i0_1;
  float x1;
  float x0;
  ggml_fp16_t *dst_data;
  ggml_fp16_t *src;
  float sin_theta;
  float cos_theta;
  int64_t ic;
  int64_t i0;
  int64_t i1;
  int64_t p_e;
  int64_t p_w;
  int64_t p_h;
  int64_t p_t;
  int64_t p;
  float *cache;
  int64_t i2;
  int64_t i3;
  int32_t *pos;
  float sin_sign;
  float *freq_factors;
  bool is_vision;
  bool is_mrope;
  bool is_neox;
  float corr_dims [2];
  float theta_scale;
  int ir;
  int ir1;
  int ir0;
  int dr;
  int nr;
  int nth;
  int ith;
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb0;
  int64_t ne3;
  int64_t ne2;
  int64_t ne1;
  int64_t ne0;
  size_t nb03;
  size_t nb02;
  size_t nb01;
  size_t nb00;
  int64_t ne03;
  int64_t ne02;
  int64_t ne01;
  int64_t ne00;
  int n_ctx_orig;
  int mode;
  int n_dims;
  int sections [4];
  float beta_slow;
  float beta_fast;
  float attn_factor;
  float ext_factor;
  float freq_scale;
  float freq_base;
  ggml_tensor *src2;
  ggml_tensor *src1;
  ggml_tensor *src0;
  float theta_scale_00;
  float sin_sign_00;
  float *in_stack_fffffffffffffc28;
  long in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  float sin_sign_01;
  float *in_stack_fffffffffffffc40;
  float *in_stack_fffffffffffffc48;
  long in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc58 [16];
  undefined1 in_stack_fffffffffffffc68 [16];
  float in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc7c;
  float in_stack_fffffffffffffc80;
  undefined2 uVar14;
  float in_stack_fffffffffffffc84;
  undefined1 in_stack_fffffffffffffc88 [16];
  undefined2 local_34a;
  long local_320;
  undefined2 local_2c2;
  long local_2a0;
  undefined2 local_23a;
  long local_210;
  undefined2 local_1aa;
  long local_180;
  long local_178;
  long local_140;
  long local_138;
  undefined1 local_110 [8];
  float local_108;
  int local_104;
  float local_100;
  int local_fc;
  int local_f8;
  float local_f4;
  int local_f0;
  int local_ec;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_64;
  uint local_60;
  int local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  float local_34;
  int *local_30;
  undefined8 local_28;
  long local_20;
  byte local_11;
  long local_10;
  int *local_8;
  
  local_11 = in_DL & 1;
  local_20 = *(long *)(in_RSI + 0x98);
  local_28 = *(undefined8 *)(in_RSI + 0xa0);
  local_30 = *(int **)(in_RSI + 0xa8);
  local_5c = *(int *)(in_RSI + 0x58);
  local_60 = *(uint *)(in_RSI + 0x5c);
  local_64 = *(undefined4 *)(in_RSI + 100);
  local_34 = *(float *)(in_RSI + 0x68);
  local_38 = *(undefined4 *)(in_RSI + 0x6c);
  local_3c = *(undefined4 *)(in_RSI + 0x70);
  local_40 = *(undefined4 *)(in_RSI + 0x74);
  local_44 = *(undefined4 *)(in_RSI + 0x78);
  local_48 = *(undefined4 *)(in_RSI + 0x7c);
  local_58 = *(undefined8 *)(in_RSI + 0x80);
  local_50 = *(undefined8 *)(in_RSI + 0x88);
  local_70 = *(undefined8 *)(local_20 + 0x10);
  local_78 = *(undefined8 *)(local_20 + 0x18);
  local_80 = *(undefined8 *)(local_20 + 0x20);
  local_88 = *(undefined8 *)(local_20 + 0x28);
  local_90 = *(long *)(local_20 + 0x30);
  local_98 = *(long *)(local_20 + 0x38);
  local_a0 = *(long *)(local_20 + 0x40);
  local_a8 = *(long *)(local_20 + 0x48);
  local_b0 = *(long *)(in_RSI + 0x10);
  local_b8 = *(long *)(in_RSI + 0x18);
  local_c0 = *(long *)(in_RSI + 0x20);
  local_c8 = *(long *)(in_RSI + 0x28);
  local_d0 = *(long *)(in_RSI + 0x30);
  local_d8 = *(long *)(in_RSI + 0x38);
  local_e0 = *(long *)(in_RSI + 0x40);
  local_e8 = *(long *)(in_RSI + 0x48);
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (local_d0 != 2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x14b9,"GGML_ASSERT(%s) failed","nb0 == sizeof(ggml_fp16_t)");
  }
  local_ec = *local_8;
  local_f0 = local_8[1];
  local_f4 = (float)ggml_nrows(local_10);
  if (local_b0 < local_5c) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x14c0,"GGML_ASSERT(%s) failed","n_dims <= ne0");
  }
  if (local_5c % 2 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x14c1,"GGML_ASSERT(%s) failed","n_dims % 2 == 0");
  }
  local_f8 = ((int)local_f4 + local_f0 + -1) / local_f0;
  local_fc = local_f8 * local_ec;
  sin_sign_01 = local_f4;
  if (local_fc + local_f8 < (int)local_f4) {
    sin_sign_01 = (float)(local_fc + local_f8);
  }
  local_104 = 0;
  local_100 = sin_sign_01;
  local_108 = powf(local_34,-2.0 / (float)local_5c);
  ggml_rope_yarn_corr_dims(local_34,local_44,local_48,local_5c,local_64,local_110);
  uVar4 = local_60 & 2;
  bVar9 = (local_60 & 8) != 0;
  bVar10 = local_60 == 0x18;
  if ((((bVar9) && ((int)local_58 < 1)) && (local_58._4_4_ < 1)) && ((int)local_50 < 1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x14d7,"GGML_ASSERT(%s) failed",
               "sections[0] > 0 || sections[1] > 0 || sections[2] > 0");
  }
  if ((bVar10) &&
     (in_stack_fffffffffffffc30 = (long)local_5c, in_stack_fffffffffffffc30 != local_b0 / 2)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x14db,"GGML_ASSERT(%s) failed","n_dims == ne0/2");
  }
  if (local_30 != (int *)0x0) {
    if (*local_30 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x14e0,"GGML_ASSERT(%s) failed","src2->type == GGML_TYPE_F32");
    }
    in_stack_fffffffffffffc28 = *(float **)(local_30 + 4);
    if ((long)in_stack_fffffffffffffc28 < (long)(local_5c / 2)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x14e1,"GGML_ASSERT(%s) failed","src2->ne[0] >= n_dims / 2");
    }
  }
  theta_scale_00 = -1.0;
  sin_sign_00 = 1.0;
  if ((local_11 & 1) == 0) {
    sin_sign_00 = -1.0;
  }
  local_138 = 0;
  do {
    if (local_c8 <= local_138) {
      return;
    }
    for (local_140 = 0; local_140 < local_c0; local_140 = local_140 + 1) {
      lVar5 = *(long *)(local_8 + 4) + (local_b0 + 0x10) * (long)local_ec * 4;
      if (bVar9) {
        ggml_mrope_cache_init
                  (in_stack_fffffffffffffc84,in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
                   in_stack_fffffffffffffc78,in_stack_fffffffffffffc68._8_8_,
                   in_stack_fffffffffffffc68[7],in_stack_fffffffffffffc68._0_4_,
                   in_stack_fffffffffffffc58._8_8_,in_stack_fffffffffffffc58._0_8_,
                   in_stack_fffffffffffffc50,(float)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                   SUB84(in_stack_fffffffffffffc48,0),in_stack_fffffffffffffc40,sin_sign_01,
                   in_stack_fffffffffffffc88._8_4_);
      }
      else {
        ggml_rope_cache_init
                  ((float)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                   (float)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                   in_stack_fffffffffffffc40,CONCAT44(sin_sign_01,in_stack_fffffffffffffc38),
                   (float)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                   (float)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,sin_sign_00,
                   theta_scale_00);
      }
      for (local_178 = 0; local_178 < local_b8; local_178 = local_178 + 1) {
        iVar8 = local_104 + 1;
        bVar3 = local_fc <= local_104;
        local_104 = iVar8;
        if (bVar3) {
          if ((int)local_100 < iVar8) break;
          if ((uVar4 != 0) || (bVar9)) {
            if (bVar10) {
              for (local_180 = 0; local_180 < local_5c; local_180 = local_180 + 2) {
                fVar1 = *(float *)(lVar5 + local_180 * 4);
                fVar2 = *(float *)(lVar5 + 4 + local_180 * 4);
                pgVar6 = (ggml_fp16_t *)
                         (*(long *)(local_20 + 0xf8) + local_138 * local_a8 + local_140 * local_a0 +
                          local_178 * local_98 + (local_180 / 2) * local_90);
                puVar7 = (undefined2 *)
                         (*(long *)(local_10 + 0xf8) + local_138 * local_e8 + local_140 * local_e0 +
                          local_178 * local_d8 + (local_180 / 2) * local_d0);
                fVar11 = ggml_lookup_fp16_to_fp32(*pgVar6);
                fVar12 = ggml_lookup_fp16_to_fp32(pgVar6[local_5c]);
                auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar11),
                                          ZEXT416((uint)(fVar12 * fVar2)));
                auVar13 = vblendps_avx(ZEXT816(0),auVar13,1);
                auVar13 = vcvtps2ph_f16c(auVar13,0);
                vpextrw_avx(auVar13,0);
                *puVar7 = local_1aa;
                auVar13 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar11),
                                          ZEXT416((uint)(fVar12 * fVar1)));
                auVar13 = vblendps_avx(ZEXT816(0),auVar13,1);
                auVar13 = vcvtps2ph_f16c(auVar13,0);
                puVar7[local_5c] = auVar13._0_2_;
              }
            }
            else {
              for (local_210 = 0; local_210 < local_5c; local_210 = local_210 + 2) {
                fVar1 = *(float *)(lVar5 + local_210 * 4);
                fVar2 = *(float *)(lVar5 + 4 + local_210 * 4);
                pgVar6 = (ggml_fp16_t *)
                         (*(long *)(local_20 + 0xf8) + local_138 * local_a8 + local_140 * local_a0 +
                          local_178 * local_98 + (local_210 / 2) * local_90);
                puVar7 = (undefined2 *)
                         (*(long *)(local_10 + 0xf8) + local_138 * local_e8 + local_140 * local_e0 +
                          local_178 * local_d8 + (local_210 / 2) * local_d0);
                fVar11 = ggml_lookup_fp16_to_fp32(*pgVar6);
                fVar12 = ggml_lookup_fp16_to_fp32(pgVar6[local_5c / 2]);
                auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar11),
                                          ZEXT416((uint)(fVar12 * fVar2)));
                auVar13 = vblendps_avx(ZEXT816(0),auVar13,1);
                auVar13 = vcvtps2ph_f16c(auVar13,0);
                vpextrw_avx(auVar13,0);
                *puVar7 = local_23a;
                auVar13 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar11),
                                          ZEXT416((uint)(fVar12 * fVar1)));
                auVar13 = vblendps_avx(ZEXT816(0),auVar13,1);
                auVar13 = vcvtps2ph_f16c(auVar13,0);
                puVar7[local_5c / 2] = auVar13._0_2_;
              }
            }
          }
          else {
            for (local_2a0 = 0; local_2a0 < local_5c; local_2a0 = local_2a0 + 2) {
              fVar1 = *(float *)(lVar5 + local_2a0 * 4);
              fVar2 = *(float *)(lVar5 + 4 + local_2a0 * 4);
              pgVar6 = (ggml_fp16_t *)
                       (*(long *)(local_20 + 0xf8) + local_138 * local_a8 + local_140 * local_a0 +
                        local_178 * local_98 + local_2a0 * local_90);
              puVar7 = (undefined2 *)
                       (*(long *)(local_10 + 0xf8) + local_138 * local_e8 + local_140 * local_e0 +
                        local_178 * local_d8 + local_2a0 * local_d0);
              fVar11 = ggml_lookup_fp16_to_fp32(*pgVar6);
              fVar12 = ggml_lookup_fp16_to_fp32(pgVar6[1]);
              auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar11),
                                        ZEXT416((uint)(fVar12 * fVar2)));
              auVar13 = vblendps_avx(ZEXT816(0),auVar13,1);
              auVar13 = vcvtps2ph_f16c(auVar13,0);
              vpextrw_avx(auVar13,0);
              *puVar7 = local_2c2;
              auVar13 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar11),
                                        ZEXT416((uint)(fVar12 * fVar1)));
              auVar13 = vblendps_avx(ZEXT816(0),auVar13,1);
              auVar13 = vcvtps2ph_f16c(auVar13,0);
              puVar7[1] = auVar13._0_2_;
            }
          }
          if (bVar10) {
            for (local_320 = (long)local_5c; local_320 < local_b0; local_320 = local_320 + 2) {
              fVar1 = *(float *)(lVar5 + local_320 * 4);
              fVar2 = *(float *)(lVar5 + 4 + local_320 * 4);
              pgVar6 = (ggml_fp16_t *)
                       (*(long *)(local_20 + 0xf8) + local_138 * local_a8 + local_140 * local_a0 +
                        local_178 * local_98 + (local_320 / 2) * local_90);
              puVar7 = (undefined2 *)
                       (*(long *)(local_10 + 0xf8) + local_138 * local_e8 + local_140 * local_e0 +
                        local_178 * local_d8 + (local_320 / 2) * local_d0);
              fVar11 = ggml_lookup_fp16_to_fp32(*pgVar6);
              uVar14 = SUB42(in_stack_fffffffffffffc84,0);
              fVar12 = ggml_lookup_fp16_to_fp32(pgVar6[local_5c]);
              auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar11),
                                        ZEXT416((uint)(fVar12 * fVar2)));
              in_stack_fffffffffffffc88 = vblendps_avx(ZEXT816(0),auVar13,1);
              auVar13 = vcvtps2ph_f16c(in_stack_fffffffffffffc88,0);
              vpextrw_avx(auVar13,0);
              *puVar7 = local_34a;
              auVar13 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar11),
                                        ZEXT416((uint)(fVar12 * fVar1)));
              in_stack_fffffffffffffc58 = vblendps_avx(ZEXT816(0),auVar13,1);
              in_stack_fffffffffffffc68 = vcvtps2ph_f16c(in_stack_fffffffffffffc58,0);
              in_stack_fffffffffffffc84 = (float)CONCAT22(in_stack_fffffffffffffc68._0_2_,uVar14);
              puVar7[local_5c] = in_stack_fffffffffffffc68._0_2_;
            }
          }
          else {
            for (in_stack_fffffffffffffc50 = (long)local_5c; in_stack_fffffffffffffc50 < local_b0;
                in_stack_fffffffffffffc50 = in_stack_fffffffffffffc50 + 2) {
              in_stack_fffffffffffffc48 =
                   (float *)(*(long *)(local_20 + 0xf8) + local_138 * local_a8 +
                             local_140 * local_a0 + local_178 * local_98 +
                            in_stack_fffffffffffffc50 * local_90);
              in_stack_fffffffffffffc40 =
                   (float *)(*(long *)(local_10 + 0xf8) + local_138 * local_e8 +
                             local_140 * local_e0 + local_178 * local_d8 +
                            in_stack_fffffffffffffc50 * local_d0);
              *(undefined2 *)in_stack_fffffffffffffc40 = *(undefined2 *)in_stack_fffffffffffffc48;
              *(undefined2 *)((long)in_stack_fffffffffffffc40 + 2) =
                   *(undefined2 *)((long)in_stack_fffffffffffffc48 + 2);
            }
          }
        }
      }
    }
    local_138 = local_138 + 1;
  } while( true );
}

Assistant:

static void ggml_compute_forward_rope_f16(
        const ggml_compute_params * params,
        ggml_tensor * dst,
        const bool forward) {

    const ggml_tensor * src0 = dst->src[0];
    const ggml_tensor * src1 = dst->src[1];
    const ggml_tensor * src2 = dst->src[2];

    float freq_base, freq_scale, ext_factor, attn_factor, beta_fast, beta_slow;
    int sections[4];

    //const int n_past     = ((int32_t *) dst->op_params)[0];
    const int n_dims     = ((int32_t *) dst->op_params)[1];
    const int mode       = ((int32_t *) dst->op_params)[2];
    //const int n_ctx      = ((int32_t *) dst->op_params)[3];
    const int n_ctx_orig = ((int32_t *) dst->op_params)[4];
    memcpy(&freq_base,   (int32_t *) dst->op_params +  5, sizeof(float));
    memcpy(&freq_scale,  (int32_t *) dst->op_params +  6, sizeof(float));
    memcpy(&ext_factor,  (int32_t *) dst->op_params +  7, sizeof(float));
    memcpy(&attn_factor, (int32_t *) dst->op_params +  8, sizeof(float));
    memcpy(&beta_fast,   (int32_t *) dst->op_params +  9, sizeof(float));
    memcpy(&beta_slow,   (int32_t *) dst->op_params + 10, sizeof(float));
    memcpy(&sections,    (int32_t *) dst->op_params + 11, sizeof(int)*4);


    GGML_TENSOR_UNARY_OP_LOCALS

    //printf("ne0: %d, ne1: %d, ne2: %d, ne3: %d\n", ne0, ne1, ne2, ne3);
    //printf("n_past = %d, ne2 = %d\n", n_past, ne2);

    GGML_ASSERT(nb0 == sizeof(ggml_fp16_t));

    const int ith = params->ith;
    const int nth = params->nth;

    const int nr = ggml_nrows(dst);

    GGML_ASSERT(n_dims <= ne0);
    GGML_ASSERT(n_dims % 2 == 0);

    // rows per thread
    const int dr = (nr + nth - 1)/nth;

    // row range for this thread
    const int ir0 = dr*ith;
    const int ir1 = MIN(ir0 + dr, nr);

    // row index used to determine which thread to use
    int ir = 0;

    const float theta_scale = powf(freq_base, -2.0f/n_dims);

    float corr_dims[2];
    ggml_rope_yarn_corr_dims(n_dims, n_ctx_orig, freq_base, beta_fast, beta_slow, corr_dims);

    const bool is_neox = mode & GGML_ROPE_TYPE_NEOX;
    const bool is_mrope = mode & GGML_ROPE_TYPE_MROPE;
    const bool is_vision = mode == GGML_ROPE_TYPE_VISION;

    if (is_mrope) {
        GGML_ASSERT(sections[0] > 0 || sections[1] > 0 || sections[2] > 0);
    }

    if (is_vision) {
        GGML_ASSERT(n_dims == ne0/2);
    }

    const float * freq_factors = NULL;
    if (src2 != NULL) {
        GGML_ASSERT(src2->type == GGML_TYPE_F32);
        GGML_ASSERT(src2->ne[0] >= n_dims / 2);
        freq_factors = (const float *) src2->data;
    }

    // backward process uses inverse rotation by cos and sin.
    // cos and sin build a rotation matrix, where the inverse is the transpose.
    // this essentially just switches the sign of sin.
    const float sin_sign = forward ? 1.0f : -1.0f;

    const int32_t * pos = (const int32_t *) src1->data;

    for (int64_t i3 = 0; i3 < ne3; i3++) {
        for (int64_t i2 = 0; i2 < ne2; i2++) {

            float * cache = (float *) params->wdata + (ne0 + CACHE_LINE_SIZE_F32)*ith;
            if (!is_mrope) {
                const int64_t p = pos[i2];
                ggml_rope_cache_init(p, freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }
            else {
                const int64_t p_t = pos[i2];
                const int64_t p_h = pos[i2 + ne2];
                const int64_t p_w = pos[i2 + ne2 * 2];
                const int64_t p_e = pos[i2 + ne2 * 3];
                ggml_mrope_cache_init(
                    p_t, p_h, p_w, p_e, sections, is_vision,
                    freq_scale, freq_factors, corr_dims, ne0, ext_factor, attn_factor, cache, sin_sign, theta_scale);
            }

            for (int64_t i1 = 0; i1 < ne1; i1++) {
                if (ir++ < ir0) continue;
                if (ir   > ir1) break;

                if (is_neox || is_mrope) {
                    if (is_vision) {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = GGML_FP16_TO_FP32(src[0]);
                            const float x1 = GGML_FP16_TO_FP32(src[n_dims]);

                            dst_data[0]      = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                            dst_data[n_dims] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                        }
                    } else {
                        for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                            const int64_t ic = i0/2;

                            const float cos_theta = cache[i0 + 0];
                            const float sin_theta = cache[i0 + 1];

                            const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                            ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                            const float x0 = GGML_FP16_TO_FP32(src[0]);
                            const float x1 = GGML_FP16_TO_FP32(src[n_dims/2]);

                            dst_data[0]        = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                            dst_data[n_dims/2] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                        }
                    }
                } else {
                    for (int64_t i0 = 0; i0 < n_dims; i0 += 2) {
                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                              ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        const float x0 = GGML_FP16_TO_FP32(src[0]);
                        const float x1 = GGML_FP16_TO_FP32(src[1]);

                        dst_data[0] = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                        dst_data[1] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                    }
                }

                if (is_vision) {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const int64_t ic = i0/2;

                        const float cos_theta = cache[i0 + 0];
                        const float sin_theta = cache[i0 + 1];

                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + ic*nb00);
                        ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + ic*nb0);

                        const float x0 = GGML_FP16_TO_FP32(src[0]);
                        const float x1 = GGML_FP16_TO_FP32(src[n_dims]);

                        dst_data[0]      = GGML_FP32_TO_FP16(x0*cos_theta - x1*sin_theta);
                        dst_data[n_dims] = GGML_FP32_TO_FP16(x0*sin_theta + x1*cos_theta);
                    }
                } else {
                    for (int64_t i0 = n_dims; i0 < ne0; i0 += 2) {
                        const ggml_fp16_t * const src = (ggml_fp16_t *)((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01 + i0*nb00);
                        ggml_fp16_t * dst_data  = (ggml_fp16_t *)((char *)  dst->data + i3*nb3  + i2*nb2  + i1*nb1  + i0*nb0);

                        dst_data[0] = src[0];
                        dst_data[1] = src[1];
                    }
                }
            }
        }
    }
}